

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

wchar_t slot_by_type(player *p,wchar_t type,_Bool full)

{
  ushort uVar1;
  equip_slot *peVar2;
  wchar_t wVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = (p->body).count;
  lVar6 = 0x18;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  while( true ) {
    if (uVar1 == uVar5) break;
    peVar2 = (p->body).slots;
    if ((uint)*(ushort *)((long)peVar2 + lVar6 + -0x10) == type) {
      if (*(long *)((long)&peVar2->next + lVar6) == 0) goto LAB_0018cbec;
      if ((wchar_t)uVar4 == (uint)uVar1) {
        uVar4 = uVar5 & 0xffffffff;
      }
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x20;
  }
  uVar5 = (ulong)uVar1;
LAB_0018cbec:
  wVar3 = (wchar_t)uVar4;
  if ((wchar_t)uVar5 != (uint)uVar1) {
    wVar3 = (wchar_t)uVar5;
  }
  return wVar3;
}

Assistant:

static int slot_by_type(struct player *p, int type, bool full)
{
	int i, fallback = p->body.count;

	/* Look for a correct slot type */
	for (i = 0; i < p->body.count; i++) {
		if (type == p->body.slots[i].type) {
			if (full) {
				/* Found a full slot */
				if (p->body.slots[i].obj != NULL) break;
			} else {
				/* Found an empty slot */
				if (p->body.slots[i].obj == NULL) break;
			}
			/* Not right for full/empty, but still the right type */
			if (fallback == p->body.count)
				fallback = i;
		}
	}

	/* Index for the best slot we found, or p->body.count if none found  */
	return (i != p->body.count) ? i : fallback;
}